

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::test_ToUpper::test_method(test_ToUpper *this)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  bool bVar1;
  long in_FS_OFFSET;
  char *in_stack_fffffffffffffa88;
  char *in_stack_fffffffffffffa90;
  char *in_stack_fffffffffffffa98;
  char *in_stack_fffffffffffffaa0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffaa8;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  const_string *in_stack_fffffffffffffab0;
  const_string *msg;
  size_t in_stack_fffffffffffffab8;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffffac0;
  char *file;
  unit_test_log_t *in_stack_fffffffffffffac8;
  unit_test_log_t *this_01;
  size_t in_stack_fffffffffffffae0;
  undefined1 *puVar2;
  char *in_stack_fffffffffffffae8;
  char *pcVar3;
  undefined1 local_388 [16];
  undefined1 local_378 [32];
  undefined1 local_358 [16];
  const_string local_348 [2];
  undefined1 local_328 [16];
  undefined1 local_318 [32];
  undefined1 local_2f8 [48];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [70];
  lazy_ostream local_272;
  undefined1 local_260 [64];
  lazy_ostream local_220;
  undefined1 local_208 [70];
  lazy_ostream local_1c2;
  undefined1 local_1b0 [70];
  lazy_ostream local_16a;
  undefined1 local_158 [70];
  lazy_ostream local_112;
  undefined1 local_100 [70];
  lazy_ostream local_ba;
  undefined1 local_a8 [64];
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (unsigned_long)in_stack_fffffffffffffa88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
               in_stack_fffffffffffffab0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa90,(char (*) [1])in_stack_fffffffffffffa88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (unsigned_long)in_stack_fffffffffffffa88);
    local_ba._vptr_lazy_ostream._1_1_ = ToUpper((char)((ulong)in_stack_fffffffffffffa88 >> 0x38));
    local_ba._vptr_lazy_ostream._0_1_ = 0x60;
    in_stack_fffffffffffffa98 = "\'`\'";
    in_stack_fffffffffffffa90 = (char *)&local_ba;
    in_stack_fffffffffffffa88 = "ToUpper(\'`\')";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
              (local_a8,(undefined1 *)((long)&local_ba._vptr_lazy_ostream + 2),0x501,1,2,
               (undefined1 *)((long)&local_ba._vptr_lazy_ostream + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffa88);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (unsigned_long)in_stack_fffffffffffffa88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
               in_stack_fffffffffffffab0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa90,(char (*) [1])in_stack_fffffffffffffa88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (unsigned_long)in_stack_fffffffffffffa88);
    local_112._vptr_lazy_ostream._1_1_ = ToUpper((char)((ulong)in_stack_fffffffffffffa88 >> 0x38));
    local_112._vptr_lazy_ostream._0_1_ = 0x41;
    in_stack_fffffffffffffa98 = "\'A\'";
    in_stack_fffffffffffffa90 = (char *)&local_112;
    in_stack_fffffffffffffa88 = "ToUpper(\'a\')";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
              (local_100,(undefined1 *)((long)&local_112._vptr_lazy_ostream + 2),0x502,1,2,
               (undefined1 *)((long)&local_112._vptr_lazy_ostream + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffa88);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (unsigned_long)in_stack_fffffffffffffa88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
               in_stack_fffffffffffffab0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa90,(char (*) [1])in_stack_fffffffffffffa88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (unsigned_long)in_stack_fffffffffffffa88);
    local_16a._vptr_lazy_ostream._1_1_ = ToUpper((char)((ulong)in_stack_fffffffffffffa88 >> 0x38));
    local_16a._vptr_lazy_ostream._0_1_ = 0x5a;
    in_stack_fffffffffffffa98 = "\'Z\'";
    in_stack_fffffffffffffa90 = (char *)&local_16a;
    in_stack_fffffffffffffa88 = "ToUpper(\'z\')";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
              (local_158,(undefined1 *)((long)&local_16a._vptr_lazy_ostream + 2),0x503,1,2,
               (undefined1 *)((long)&local_16a._vptr_lazy_ostream + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffa88);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (unsigned_long)in_stack_fffffffffffffa88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
               in_stack_fffffffffffffab0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa90,(char (*) [1])in_stack_fffffffffffffa88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (unsigned_long)in_stack_fffffffffffffa88);
    local_1c2._vptr_lazy_ostream._1_1_ = ToUpper((char)((ulong)in_stack_fffffffffffffa88 >> 0x38));
    local_1c2._vptr_lazy_ostream._0_1_ = 0x7b;
    in_stack_fffffffffffffa98 = "\'{\'";
    in_stack_fffffffffffffa90 = (char *)&local_1c2;
    in_stack_fffffffffffffa88 = "ToUpper(\'{\')";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
              (local_1b0,(undefined1 *)((long)&local_1c2._vptr_lazy_ostream + 2),0x504,1,2,
               (undefined1 *)((long)&local_1c2._vptr_lazy_ostream + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffa88);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (unsigned_long)in_stack_fffffffffffffa88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
               in_stack_fffffffffffffab0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa90,(char (*) [1])in_stack_fffffffffffffa88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (unsigned_long)in_stack_fffffffffffffa88);
    local_220._vptr_lazy_ostream._7_1_ = ToUpper((char)((ulong)in_stack_fffffffffffffa88 >> 0x38));
    local_220._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffffa98 = "0";
    in_stack_fffffffffffffa90 = (char *)&local_220;
    in_stack_fffffffffffffa88 = "ToUpper(0)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,int>
              (local_208,&local_220.m_empty,0x505,1,2,
               (undefined1 *)((long)&local_220._vptr_lazy_ostream + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffa88);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (unsigned_long)in_stack_fffffffffffffa88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
               in_stack_fffffffffffffab0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa90,(char (*) [1])in_stack_fffffffffffffa88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (unsigned_long)in_stack_fffffffffffffa88);
    local_272._vptr_lazy_ostream._1_1_ = ToUpper((char)((ulong)in_stack_fffffffffffffa88 >> 0x38));
    local_272._vptr_lazy_ostream._0_1_ = 0xff;
    in_stack_fffffffffffffa98 = "\'\\xff\'";
    in_stack_fffffffffffffa90 = (char *)&local_272;
    in_stack_fffffffffffffa88 = "ToUpper(\'\\xff\')";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
              (local_260,(undefined1 *)((long)&local_272._vptr_lazy_ostream + 2),0x506,1,2,
               (undefined1 *)((long)&local_272._vptr_lazy_ostream + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffa88);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (unsigned_long)in_stack_fffffffffffffa88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
               in_stack_fffffffffffffab0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa90,(char (*) [1])in_stack_fffffffffffffa88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (unsigned_long)in_stack_fffffffffffffa88);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
    str._M_str = in_stack_fffffffffffffae8;
    str._M_len = in_stack_fffffffffffffae0;
    ToUpper_abi_cxx11_(str);
    in_stack_fffffffffffffa98 = "\"\"";
    in_stack_fffffffffffffa90 = "";
    in_stack_fffffffffffffa88 = "ToUpper(\"\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_2b8,local_2c8,0x508,1,2,local_28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa88);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffa88);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    pcVar3 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (unsigned_long)in_stack_fffffffffffffa88);
    puVar2 = local_2f8;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
               in_stack_fffffffffffffab0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa90,(char (*) [1])in_stack_fffffffffffffa88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (unsigned_long)in_stack_fffffffffffffa88);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
    str_00._M_str = pcVar3;
    str_00._M_len = (size_t)puVar2;
    ToUpper_abi_cxx11_(str_00);
    in_stack_fffffffffffffa98 = "\"#HODL\"";
    in_stack_fffffffffffffa90 = "#HODL";
    in_stack_fffffffffffffa88 = "ToUpper(\"#hodl\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
              (local_318,local_328,0x509,1,2,local_48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa88);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffa88);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    msg = local_348;
    this_01 = (unit_test_log_t *)0x63;
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (unsigned_long)in_stack_fffffffffffffa88);
    line_num = local_358;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_01,(const_string *)file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa90,(char (*) [1])in_stack_fffffffffffffa88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               (unsigned_long)in_stack_fffffffffffffa88);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_00,in_stack_fffffffffffffaa0);
    str_01._M_str = pcVar3;
    str_01._M_len = (size_t)puVar2;
    ToUpper_abi_cxx11_(str_01);
    in_stack_fffffffffffffa98 = "\"\\x00\\xfe\\xff\"";
    in_stack_fffffffffffffa90 = "";
    in_stack_fffffffffffffa88 = "ToUpper(\"\\x00\\xfe\\xff\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
              (local_378,local_388,0x50a,1,2,local_68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa88);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffa88);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ToUpper)
{
    BOOST_CHECK_EQUAL(ToUpper('`'), '`');
    BOOST_CHECK_EQUAL(ToUpper('a'), 'A');
    BOOST_CHECK_EQUAL(ToUpper('z'), 'Z');
    BOOST_CHECK_EQUAL(ToUpper('{'), '{');
    BOOST_CHECK_EQUAL(ToUpper(0), 0);
    BOOST_CHECK_EQUAL(ToUpper('\xff'), '\xff');

    BOOST_CHECK_EQUAL(ToUpper(""), "");
    BOOST_CHECK_EQUAL(ToUpper("#hodl"), "#HODL");
    BOOST_CHECK_EQUAL(ToUpper("\x00\xfe\xff"), "\x00\xfe\xff");
}